

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::CommissionerImpl::DecodeActiveOperationalDataset
                  (Error *__return_storage_ptr__,ActiveOperationalDataset *aDataset,
                  ByteArray *aPayload)

{
  ErrorCode EVar1;
  pointer puVar2;
  undefined4 uVar3;
  Error *pEVar4;
  __shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ByteArray *pBVar6;
  unsigned_long aValue;
  mapped_type channelMask;
  mapped_type activeTimeStamp;
  TlvSet tlvSet;
  ActiveOperationalDataset dataset;
  __shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> local_170;
  allocator_type local_159;
  undefined1 local_158 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150 [4];
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  local_130;
  undefined1 local_100 [72];
  uchar local_b8;
  unsigned_short local_b6;
  ChannelMask local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  unsigned_short local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  ushort local_30;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_130._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_130._M_impl.super__Rb_tree_header._M_header;
  local_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_130._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_130._M_impl.super__Rb_tree_header._M_header._M_right =
       local_130._M_impl.super__Rb_tree_header._M_header._M_left;
  ActiveOperationalDataset::ActiveOperationalDataset((ActiveOperationalDataset *)local_100);
  local_30 = 0;
  tlv::GetTlvSet((Error *)local_158,(TlvSet *)&local_130,aPayload,kMeshCoP);
  pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_158);
  EVar1 = pEVar4->mCode;
  std::__cxx11::string::~string((string *)local_150);
  if (EVar1 == kNone) {
    local_170._M_ptr._0_1_ = 0xe;
    p_Var5 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_130,(key_type *)&local_170)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)local_158,
               p_Var5);
    if ((Tlv *)CONCAT44(local_158._4_4_,local_158._0_4_) != (Tlv *)0x0) {
      pBVar6 = tlv::Tlv::GetValue((Tlv *)CONCAT44(local_158._4_4_,local_158._0_4_));
      aValue = utils::Decode<unsigned_long>(pBVar6);
      local_100._0_8_ = Timestamp::Decode(aValue);
      local_30 = local_30 | 0x8000;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_150);
    local_170._M_ptr._0_1_ = 0;
    p_Var5 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_130,(key_type *)&local_170)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)local_158,
               p_Var5);
    if ((Tlv *)CONCAT44(local_158._4_4_,local_158._0_4_) != (Tlv *)0x0) {
      pBVar6 = tlv::Tlv::GetValue((Tlv *)CONCAT44(local_158._4_4_,local_158._0_4_));
      puVar2 = (pBVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_b8 = *puVar2;
      local_b6 = utils::Decode<unsigned_short>
                           (puVar2 + 1,
                            (size_t)((pBVar6->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_finish + ~(ulong)puVar2));
      local_30 = local_30 | 0x4000;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_150);
    local_158[0] = 0x35;
    p_Var5 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_130,local_158)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_170,p_Var5);
    if ((Tlv *)CONCAT71(local_170._M_ptr._1_7_,local_170._M_ptr._0_1_) != (Tlv *)0x0) {
      pBVar6 = tlv::Tlv::GetValue((Tlv *)CONCAT71(local_170._M_ptr._1_7_,local_170._M_ptr._0_1_));
      DecodeChannelMask((Error *)local_158,&local_b0,pBVar6);
      uVar3 = local_158._0_4_;
      std::__cxx11::string::~string((string *)local_150);
      if (uVar3 != kNone) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170._M_refcount);
        goto LAB_00157257;
      }
      local_30 = local_30 | 0x2000;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170._M_refcount);
    local_170._M_ptr._0_1_ = 2;
    p_Var5 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_130,(key_type *)&local_170)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)local_158,
               p_Var5);
    if ((Tlv *)CONCAT44(local_158._4_4_,local_158._0_4_) != (Tlv *)0x0) {
      pBVar6 = tlv::Tlv::GetValue((Tlv *)CONCAT44(local_158._4_4_,local_158._0_4_));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_100 + 8),pBVar6);
      local_30 = local_30 | 0x1000;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_150);
    local_170._M_ptr._0_1_ = 7;
    p_Var5 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_130,(key_type *)&local_170)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)local_158,
               p_Var5);
    if ((Tlv *)CONCAT44(local_158._4_4_,local_158._0_4_) != (Tlv *)0x0) {
      pBVar6 = tlv::Tlv::GetValue((Tlv *)CONCAT44(local_158._4_4_,local_158._0_4_));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_98,pBVar6);
      local_30 = local_30 | 0x800;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_150);
    local_170._M_ptr._0_1_ = 5;
    p_Var5 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_130,(key_type *)&local_170)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)local_158,
               p_Var5);
    if ((Tlv *)CONCAT44(local_158._4_4_,local_158._0_4_) != (Tlv *)0x0) {
      pBVar6 = tlv::Tlv::GetValue((Tlv *)CONCAT44(local_158._4_4_,local_158._0_4_));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_80,pBVar6);
      local_30 = local_30 | 0x400;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_150);
    local_158[0] = 3;
    p_Var5 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_130,local_158)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_170,p_Var5);
    if ((Tlv *)CONCAT71(local_170._M_ptr._1_7_,local_170._M_ptr._0_1_) != (Tlv *)0x0) {
      tlv::Tlv::GetValueAsString_abi_cxx11_
                ((string *)local_158,(Tlv *)CONCAT71(local_170._M_ptr._1_7_,local_170._M_ptr._0_1_))
      ;
      std::__cxx11::string::operator=((string *)(local_100 + 0x28),(string *)local_158);
      std::__cxx11::string::~string((string *)local_158);
      local_30 = local_30 | 0x200;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170._M_refcount);
    local_170._M_ptr._0_1_ = 1;
    p_Var5 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_130,(key_type *)&local_170)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)local_158,
               p_Var5);
    if ((Tlv *)CONCAT44(local_158._4_4_,local_158._0_4_) != (Tlv *)0x0) {
      pBVar6 = tlv::Tlv::GetValue((Tlv *)CONCAT44(local_158._4_4_,local_158._0_4_));
      local_100._32_2_ = utils::Decode<unsigned_short>(pBVar6);
      local_30 = local_30 | 0x100;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_150);
    local_170._M_ptr._0_1_ = 4;
    p_Var5 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_130,(key_type *)&local_170)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)local_158,
               p_Var5);
    if ((Tlv *)CONCAT44(local_158._4_4_,local_158._0_4_) != (Tlv *)0x0) {
      pBVar6 = tlv::Tlv::GetValue((Tlv *)CONCAT44(local_158._4_4_,local_158._0_4_));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_68,pBVar6);
      local_30 = local_30 | 0x80;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_150);
    local_158[0] = 0xc;
    p_Var5 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_130,local_158)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_170,p_Var5);
    if ((Tlv *)CONCAT71(local_170._M_ptr._1_7_,local_170._M_ptr._0_1_) != (Tlv *)0x0) {
      pBVar6 = tlv::Tlv::GetValue((Tlv *)CONCAT71(local_170._M_ptr._1_7_,local_170._M_ptr._0_1_));
      local_50 = utils::Decode<unsigned_short>(pBVar6);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_158,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )((pBVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start + 2),
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(pBVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish,&local_159);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&local_48,(_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_158)
      ;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
      local_30 = local_30 | 0x40;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170._M_refcount);
    ActiveOperationalDataset::operator=(aDataset,(ActiveOperationalDataset *)local_100);
  }
LAB_00157257:
  ActiveOperationalDataset::~ActiveOperationalDataset((ActiveOperationalDataset *)local_100);
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&local_130);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::DecodeActiveOperationalDataset(ActiveOperationalDataset &aDataset, const ByteArray &aPayload)
{
    Error                    error;
    tlv::TlvSet              tlvSet;
    ActiveOperationalDataset dataset;

    // Clear all data fields
    dataset.mPresentFlags = 0;

    SuccessOrExit(error = tlv::GetTlvSet(tlvSet, aPayload));

    if (auto activeTimeStamp = tlvSet[tlv::Type::kActiveTimestamp])
    {
        uint64_t value;
        value                    = utils::Decode<uint64_t>(activeTimeStamp->GetValue());
        dataset.mActiveTimestamp = Timestamp::Decode(value);
        dataset.mPresentFlags |= ActiveOperationalDataset::kActiveTimestampBit;
    }

    if (auto channel = tlvSet[tlv::Type::kChannel])
    {
        const ByteArray &value   = channel->GetValue();
        dataset.mChannel.mPage   = value[0];
        dataset.mChannel.mNumber = utils::Decode<uint16_t>(value.data() + 1, value.size() - 1);
        dataset.mPresentFlags |= ActiveOperationalDataset::kChannelBit;
    }

    if (auto channelMask = tlvSet[tlv::Type::kChannelMask])
    {
        SuccessOrExit(DecodeChannelMask(dataset.mChannelMask, channelMask->GetValue()));
        dataset.mPresentFlags |= ActiveOperationalDataset::kChannelMaskBit;
    }

    if (auto extendedPanId = tlvSet[tlv::Type::kExtendedPanId])
    {
        dataset.mExtendedPanId = extendedPanId->GetValue();
        dataset.mPresentFlags |= ActiveOperationalDataset::kExtendedPanIdBit;
    }

    if (auto meshLocalPrefix = tlvSet[tlv::Type::kNetworkMeshLocalPrefix])
    {
        dataset.mMeshLocalPrefix = meshLocalPrefix->GetValue();
        dataset.mPresentFlags |= ActiveOperationalDataset::kMeshLocalPrefixBit;
    }

    if (auto networkMasterKey = tlvSet[tlv::Type::kNetworkMasterKey])
    {
        dataset.mNetworkMasterKey = networkMasterKey->GetValue();
        dataset.mPresentFlags |= ActiveOperationalDataset::kNetworkMasterKeyBit;
    }

    if (auto networkName = tlvSet[tlv::Type::kNetworkName])
    {
        dataset.mNetworkName = networkName->GetValueAsString();
        dataset.mPresentFlags |= ActiveOperationalDataset::kNetworkNameBit;
    }

    if (auto panId = tlvSet[tlv::Type::kPanId])
    {
        dataset.mPanId = utils::Decode<uint16_t>(panId->GetValue());
        dataset.mPresentFlags |= ActiveOperationalDataset::kPanIdBit;
    }

    if (auto pskc = tlvSet[tlv::Type::kPSKc])
    {
        dataset.mPSKc = pskc->GetValue();
        dataset.mPresentFlags |= ActiveOperationalDataset::kPSKcBit;
    }

    if (auto securityPolicy = tlvSet[tlv::Type::kSecurityPolicy])
    {
        auto &value                           = securityPolicy->GetValue();
        dataset.mSecurityPolicy.mRotationTime = utils::Decode<uint16_t>(value);
        dataset.mSecurityPolicy.mFlags        = {value.begin() + sizeof(uint16_t), value.end()};
        dataset.mPresentFlags |= ActiveOperationalDataset::kSecurityPolicyBit;
    }

    aDataset = dataset;

exit:
    return error;
}